

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_indexed_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_26fab4::CpuZeropageIndexedTest_and_zerox_sets_neg_Test::TestBody
          (CpuZeropageIndexedTest_and_zerox_sets_neg_Test *this)

{
  (this->super_CpuZeropageIndexedTest).super_CpuTest.registers.a = 0xaa;
  (this->super_CpuZeropageIndexedTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuZeropageIndexedTest).super_CpuTest.expected.a = 0x8a;
  (this->super_CpuZeropageIndexedTest).super_CpuTest.expected.p = 0x80;
  (this->super_CpuZeropageIndexedTest).super_CpuTest.field_0x114 = 0x8f;
  CpuZeropageIndexedTest::run_read_instruction(&this->super_CpuZeropageIndexedTest,'5',X);
  return;
}

Assistant:

TEST_F(CpuZeropageIndexedTest, and_zerox_sets_neg) {
    registers.a = 0b10101010;
    registers.p = Z_FLAG;
    expected.a = 0b10001010;
    expected.p = N_FLAG;
    memory_content = 0b10001111;

    run_read_instruction(AND_ZEROX, IndexReg::X);
}